

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O2

ImageFeatureType_EnumeratedImageSizes * __thiscall
CoreML::Specification::ImageFeatureType_EnumeratedImageSizes::New
          (ImageFeatureType_EnumeratedImageSizes *this,Arena *arena)

{
  ImageFeatureType_EnumeratedImageSizes *this_00;
  
  this_00 = (ImageFeatureType_EnumeratedImageSizes *)operator_new(0x30);
  ImageFeatureType_EnumeratedImageSizes(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::ImageFeatureType_EnumeratedImageSizes>
              (arena,this_00);
  }
  return this_00;
}

Assistant:

ImageFeatureType_EnumeratedImageSizes* ImageFeatureType_EnumeratedImageSizes::New(::google::protobuf::Arena* arena) const {
  ImageFeatureType_EnumeratedImageSizes* n = new ImageFeatureType_EnumeratedImageSizes;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}